

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

JoystickState * __thiscall
sf::priv::JoystickImpl::update(JoystickState *__return_storage_ptr__,JoystickImpl *this)

{
  ssize_t sVar1;
  int *piVar2;
  float fVar3;
  bool local_91;
  int local_60;
  float value;
  int result;
  js_event joyState;
  JoystickImpl *this_local;
  
  if (this->m_file < 0) {
    JoystickState::JoystickState((JoystickState *)&joyState);
    memcpy(&this->m_state,&joyState,0x44);
    memcpy(__return_storage_ptr__,&this->m_state,0x44);
  }
  else {
    sVar1 = read(this->m_file,&value,8);
    local_60 = (int)sVar1;
    while (0 < local_60) {
      if ((result._2_1_ & 0x7f) == 1) {
        if (result._3_1_ < 0x20) {
          (this->m_state).buttons[result._3_1_] = (short)result != 0;
        }
      }
      else if (((result._2_1_ & 0x7f) == 2) &&
              (fVar3 = ((float)(int)(short)result * 100.0) / 32767.0, result._3_1_ < 0x40)) {
        switch(this->m_mapping[result._3_1_]) {
        case '\0':
          (this->m_state).axes[0] = fVar3;
          break;
        case '\x01':
          (this->m_state).axes[1] = fVar3;
          break;
        case '\x02':
        case '\x06':
          (this->m_state).axes[2] = fVar3;
          break;
        case '\x03':
          (this->m_state).axes[4] = fVar3;
          break;
        case '\x04':
          (this->m_state).axes[5] = fVar3;
          break;
        case '\x05':
        case '\a':
          (this->m_state).axes[3] = fVar3;
          break;
        default:
          break;
        case '\x10':
          (this->m_state).axes[6] = fVar3;
          break;
        case '\x11':
          (this->m_state).axes[7] = fVar3;
        }
      }
      sVar1 = read(this->m_file,&value,8);
      local_60 = (int)sVar1;
    }
    local_91 = true;
    if (local_60 != 0) {
      piVar2 = __errno_location();
      local_91 = *piVar2 == 0xb;
    }
    (this->m_state).connected = local_91;
    memcpy(__return_storage_ptr__,&this->m_state,0x44);
  }
  return __return_storage_ptr__;
}

Assistant:

JoystickState JoystickImpl::JoystickImpl::update()
{
    if (m_file < 0)
    {
        m_state = JoystickState();
        return m_state;
    }

    // pop events from the joystick file
    js_event joyState;
    int result = read(m_file, &joyState, sizeof(joyState));
    while (result > 0)
    {
        switch (joyState.type & ~JS_EVENT_INIT)
        {
            // An axis was moved
            case JS_EVENT_AXIS:
            {
                float value = joyState.value * 100.f / 32767.f;

                if (joyState.number < ABS_MAX + 1)
                {
                    switch (m_mapping[joyState.number])
                    {
                        case ABS_X:        m_state.axes[Joystick::X]    = value; break;
                        case ABS_Y:        m_state.axes[Joystick::Y]    = value; break;
                        case ABS_Z:
                        case ABS_THROTTLE: m_state.axes[Joystick::Z]    = value; break;
                        case ABS_RZ:
                        case ABS_RUDDER:   m_state.axes[Joystick::R]    = value; break;
                        case ABS_RX:       m_state.axes[Joystick::U]    = value; break;
                        case ABS_RY:       m_state.axes[Joystick::V]    = value; break;
                        case ABS_HAT0X:    m_state.axes[Joystick::PovX] = value; break;
                        case ABS_HAT0Y:    m_state.axes[Joystick::PovY] = value; break;
                        default:           break;
                    }
                }
                break;
            }

            // A button was pressed
            case JS_EVENT_BUTTON:
            {
                if (joyState.number < Joystick::ButtonCount)
                    m_state.buttons[joyState.number] = (joyState.value != 0);
                break;
            }
        }

        result = read(m_file, &joyState, sizeof(joyState));
    }

    // Check the connection state of the joystick
    // read() returns -1 and errno != EGAIN if it's no longer connected
    // We need to check the result of read() as well, since errno could
    // have been previously set by some other function call that failed
    // result can be either negative or 0 at this point
    // If result is 0, assume the joystick is still connected
    // If result is negative, check errno and disconnect if it is not EAGAIN
    m_state.connected = (!result || (errno == EAGAIN));

    return m_state;
}